

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,floating_type f,
          floating_format_info *fmt,source_location *param_3)

{
  uint *puVar1;
  void *pvVar2;
  size_type __n;
  void *pvVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_07;
  size_type __size;
  string s;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  floating_type local_2b0;
  locale local_2a8 [8];
  long *local_2a0 [2];
  long local_290 [2];
  size_type *local_280 [2];
  size_type local_270 [2];
  size_type *local_260 [2];
  size_type local_250 [2];
  size_type *local_240 [2];
  size_type local_230 [2];
  size_type *local_220 [2];
  size_type local_210 [2];
  size_type *local_200 [2];
  size_type local_1f0 [2];
  size_type *local_1e0 [2];
  size_type local_1d0 [2];
  size_type *local_1c0 [2];
  size_type local_1b0 [2];
  long local_1a0;
  long local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_2b0 = f;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::locale::classic();
  std::ios::imbue(local_2a8);
  std::locale::~locale(local_2a8);
  if (NAN(local_2b0)) {
    if ((long)local_2b0 < 0) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"nan",3);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length
                );
    }
    std::__cxx11::stringbuf::str();
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)local_1c0,s_07);
    if (local_1c0[0] == local_1b0) goto LAB_003e2e35;
  }
  else if (ABS(local_2b0) == INFINITY) {
    if ((long)local_2b0 < 0) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"inf",3);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length
                );
    }
    std::__cxx11::stringbuf::str();
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)local_1e0,s_00);
    local_1b0[0] = local_1d0[0];
    local_1c0[0] = local_1e0[0];
    if (local_1e0[0] == local_1d0) goto LAB_003e2e35;
  }
  else {
    switch(fmt->fmt) {
    case defaultfloat:
      if (fmt->prec != 0) {
        *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
      }
      std::ostream::_M_insert<double>(local_2b0);
      std::__cxx11::stringbuf::str();
      __n = local_2d0._M_string_length;
      if ((local_2d0._M_string_length == 0) ||
         ((pvVar2 = (void *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                     local_2d0._M_dataplus._M_p._0_1_),
          pvVar3 = memchr(pvVar2,0x2e,local_2d0._M_string_length),
          pvVar3 == (void *)0x0 || (long)pvVar3 - (long)pvVar2 == -1 &&
          ((__n == 0 ||
           ((pvVar2 = (void *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                       local_2d0._M_dataplus._M_p._0_1_),
            pvVar3 = memchr(pvVar2,0x65,__n),
            pvVar3 == (void *)0x0 || (long)pvVar3 - (long)pvVar2 == -1 &&
            ((__n == 0 ||
             (pvVar2 = (void *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                        local_2d0._M_dataplus._M_p._0_1_),
             pvVar3 = memchr(pvVar2,0x45,__n),
             pvVar3 == (void *)0x0 || (long)pvVar3 - (long)pvVar2 == -1)))))))))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_2d0,".0");
      }
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&local_2d0,'_');
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(&local_2d0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
      }
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,
                 CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_),
                 local_2d0._M_string_length +
                 CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_));
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)local_2a0,s_01);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0],local_290[0] + 1);
      }
      local_1c0[0] = (size_type *)
                     CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_);
      local_1b0[0] = local_2d0.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0[0] == &local_2d0.field_2) goto LAB_003e2e35;
      break;
    case fixed:
      if (fmt->prec != 0) {
        *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
      }
      *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
      std::ostream::_M_insert<double>(local_2b0);
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a0,(char *)&local_2d0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)local_200,s_04);
      local_1b0[0] = local_1f0[0];
      local_1c0[0] = local_200[0];
      if (local_200[0] == local_1f0) goto LAB_003e2e35;
      break;
    case scientific:
      if (fmt->prec != 0) {
        *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
      }
      *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 0x100;
      std::ostream::_M_insert<double>(local_2b0);
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a0,(char *)&local_2d0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)local_220,s_02);
      local_1b0[0] = local_210[0];
      local_1c0[0] = local_220[0];
      if (local_220[0] == local_210) goto LAB_003e2e35;
      break;
    case hex:
      if ((this->spec_).ext_hex_float == true) {
        puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18));
        *puVar1 = *puVar1 | 0x104;
        std::ostream::_M_insert<double>(local_2b0);
        std::__cxx11::stringbuf::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (__return_storage_ptr__,(detail *)local_240,s_03);
        local_1b0[0] = local_230[0];
        local_1c0[0] = local_240[0];
        if (local_240[0] == local_230) goto LAB_003e2e35;
      }
      else {
        *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0x11;
        *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
             *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 0x100;
        std::ostream::_M_insert<double>(local_2b0);
        std::__cxx11::stringbuf::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (__return_storage_ptr__,(detail *)local_260,s_06);
        local_1b0[0] = local_250[0];
        local_1c0[0] = local_260[0];
        if (local_260[0] == local_250) goto LAB_003e2e35;
      }
      break;
    default:
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a0,(char *)&local_2d0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)local_280,s_05);
      local_1b0[0] = local_270[0];
      local_1c0[0] = local_280[0];
      if (local_280[0] == local_270) goto LAB_003e2e35;
    }
  }
  operator_delete(local_1c0[0],local_1b0[0] + 1);
LAB_003e2e35:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const floating_type f, const floating_format_info& fmt, const source_location&) // {{{
    {
        using std::isnan;
        using std::isinf;
        using std::signbit;

        std::ostringstream oss;
        this->set_locale(oss);

        if(isnan(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "nan";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        if(isinf(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "inf";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        switch(fmt.fmt)
        {
            case floating_format::defaultfloat:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << f;
                // since defaultfloat may omit point, we need to add it
                std::string s = oss.str();
                if (s.find('.') == std::string::npos &&
                    s.find('e') == std::string::npos &&
                    s.find('E') == std::string::npos )
                {
                    s += ".0";
                }
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    s += '_';
                    s += fmt.suffix;
                }
                return string_conv<string_type>(s);
            }
            case floating_format::fixed:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::fixed << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::scientific:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::scientific << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::hex:
            {
                if(this->spec_.ext_hex_float)
                {
                    oss << std::hexfloat << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
                else // no hex allowed. output with max precision.
                {
                    oss << std::setprecision(std::numeric_limits<floating_type>::max_digits10)
                        << std::scientific << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
            }
            default:
            {
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
        }
    }